

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.cpp
# Opt level: O3

void __thiscall PcodeGenerator::InlineReplace(PcodeGenerator *this)

{
  vector<Pcode,_std::allocator<Pcode>_> *this_00;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  pointer pPVar4;
  iterator iVar5;
  Pcode *pPVar6;
  FunctionTable *this_01;
  pointer pPVar7;
  string top_label;
  int argument_number;
  string num3;
  string func_name;
  string bottom_label;
  string local_c0;
  int local_9c;
  undefined1 *local_98;
  size_t local_90;
  undefined1 local_88 [16];
  iterator local_78;
  string local_70;
  string local_50;
  
  this_01 = handle_func_table;
  handle_func_table->m_current_term_ptr = 0;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  this_00 = &this->m_pcode_queue;
LAB_00134fda:
  bVar2 = FunctionTable::GetFuncLabel(this_01,&local_c0,&local_50);
  if (!bVar2) {
    pPVar6 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (iVar5._M_current =
              (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
              super__Vector_impl_data._M_start; iVar5._M_current != pPVar6;
        iVar5._M_current = iVar5._M_current + 1) {
      if ((iVar5._M_current)->m_op == NOP) {
        iVar5 = std::vector<Pcode,_std::allocator<Pcode>_>::_M_erase(this_00,iVar5);
        pPVar6 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    return;
  }
  bVar2 = CanInline(this,&local_c0,&local_50);
  if (bVar2) {
    fprintf(_stdout,"can inline label:%s---%s\n",local_c0._M_dataplus._M_p,local_50._M_dataplus._M_p
           );
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    FunctionTable::GetCurrentTermName(handle_func_table,&local_70);
    FunctionTable::GetCurrentTermArgumentNumber(handle_func_table,&local_9c);
    pPVar7 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar4 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_78._M_current = pPVar7;
    if (pPVar7 != pPVar4) {
      do {
        if (pPVar7->m_op == CALL) {
          pcVar1 = (pPVar7->m_num3)._M_dataplus._M_p;
          local_98 = local_88;
          local_78._M_current = pPVar7;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,pcVar1,pcVar1 + (pPVar7->m_num3)._M_string_length);
          if ((local_90 == local_70._M_string_length) &&
             ((local_90 == 0 ||
              (iVar3 = bcmp(local_98,local_70._M_dataplus._M_p,local_90), iVar3 == 0)))) {
            CallReplace(this,&local_78,&local_c0,&local_50,local_9c);
          }
          if (local_98 != local_88) {
            operator_delete(local_98);
          }
          pPVar4 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        pPVar7 = pPVar7 + 1;
      } while (pPVar7 != pPVar4);
      iVar5._M_current =
           (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_78._M_current = pPVar7;
      if (iVar5._M_current != pPVar4) {
        do {
          pcVar1 = ((iVar5._M_current)->m_num1)._M_dataplus._M_p;
          local_98 = local_88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,pcVar1,
                     pcVar1 + ((iVar5._M_current)->m_num1)._M_string_length);
          if ((((iVar5._M_current)->m_op == LABEL) && (local_90 == local_c0._M_string_length)) &&
             ((local_90 == 0 ||
              (iVar3 = bcmp(local_98,local_c0._M_dataplus._M_p,local_90), iVar3 == 0))))
          goto LAB_0013516d;
          if (local_98 != local_88) {
            operator_delete(local_98);
          }
          iVar5._M_current = iVar5._M_current + 1;
        } while (iVar5._M_current !=
                 (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
    }
    goto LAB_0013519c;
  }
  goto LAB_001351ae;
LAB_0013516d:
  do {
    iVar5 = std::vector<Pcode,_std::allocator<Pcode>_>::_M_erase(this_00,iVar5);
  } while ((iVar5._M_current)->m_op != FUNC_BOTTOM);
  std::vector<Pcode,_std::allocator<Pcode>_>::_M_erase(this_00,iVar5);
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
LAB_0013519c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
LAB_001351ae:
  this_01 = handle_func_table;
  handle_func_table->m_current_term_ptr = handle_func_table->m_current_term_ptr + 1;
  goto LAB_00134fda;
}

Assistant:

void PcodeGenerator::InlineReplace() {
    handle_func_table->ZeroCurrentTermPtr();
    string top_label;
    string bottom_label;
    while (handle_func_table->GetFuncLabel(top_label, bottom_label)) {
        if (CanInline(top_label, bottom_label)){
            fprintf(stdout, "can inline label:%s---%s\n", top_label.c_str(), bottom_label.c_str());
            string func_name;
            handle_func_table->GetCurrentTermName(func_name);
            int argument_number;
            handle_func_table->GetCurrentTermArgumentNumber(argument_number);
            // replace func code
            for (auto iter=m_pcode_queue.begin(); iter!=m_pcode_queue.end(); ++iter) {
                PcodeType op = iter->GetOP();
                if (op == CALL) {
                    string num3 = iter->GetNum3();
                    if (num3 == func_name) {
                        CallReplace(iter, top_label, bottom_label, argument_number);
                    }
                }
            }
            // delete origin func
            for (auto iter=m_pcode_queue.begin(); iter != m_pcode_queue.end();) {
                string num1 = iter->GetNum1();
                PcodeType op = iter->GetOP();
                if (op == LABEL && num1 == top_label) {
                    do {
                        //fprintf(stdout, "erase---%s\n", iter->GetNum1().c_str());
                        iter = m_pcode_queue.erase(iter);
                        op = iter->GetOP();
                        //num1 = iter->GetNum1();
                    //} while (op != LABEL || num1 != bottom_label); 
                    } while (op != FUNC_BOTTOM);
                    iter = m_pcode_queue.erase(iter);
                    break;
                } else {
                    iter++;
                }
            }
        }
        handle_func_table->NextTerm();
    }
    for (auto iter = m_pcode_queue.begin(); iter != m_pcode_queue.end(); ++iter) {
        if (iter->GetOP() == NOP) {
            iter = m_pcode_queue.erase(iter);
        }
    }
}